

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channelout.cpp
# Opt level: O0

int anon_unknown.dwarf_1e83b::ChannelOut_pitchbend(lua_State *L)

{
  ChannelOut *this;
  ulong uVar1;
  lua_Integer value;
  ChannelOut *self;
  lua_State *L_local;
  
  this = getChannelOut(L,1);
  uVar1 = luaL_checkinteger(L,2);
  if (((long)uVar1 < 0) || (0x3fff < (long)uVar1)) {
    luaL_argerror(L,2,"Pitch bend position must be between 0 and 16383");
  }
  ChannelOut::send<int,long,long>(this,this->index + 0xe0,uVar1 & 0x7f,(long)uVar1 >> 7 & 0x7f);
  lua_settop(L,1);
  return 1;
}

Assistant:

int ChannelOut_pitchbend(lua_State *L) {
	auto &self = getChannelOut(L, 1);
	lua_Integer value = luaL_checkinteger(L, 2);

	luaL_argcheck(L, value >= 0 && value <= 0x3FFF, 2, "Pitch bend position must be between 0 and 16383");

	self.send(0xE0 + self.index, value & 0x7Fu, (value >> 7) & 0x7Fu);
	lua_settop(L, 1);
	return 1;
}